

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stream.cpp
# Opt level: O3

int64_t __thiscall dpfb::streams::FileStream::getSize(FileStream *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_Stream)._vptr_Stream[8])();
  iVar2 = fseek((FILE *)this->fp,0,2);
  if (iVar2 == 0) {
    iVar2 = (*(this->super_Stream)._vptr_Stream[8])(this);
    iVar1 = fseek((FILE *)this->fp,CONCAT44(extraout_var,iVar1),0);
    if (iVar1 == 0) {
      return CONCAT44(extraout_var_00,iVar2);
    }
  }
  throwErrno();
}

Assistant:

std::int64_t FileStream::getSize() const
{
    const auto pos = getPosition();
    if (std::fseek(fp, 0, SEEK_END) != 0)
        throwErrno();

    const auto size = getPosition();
    if (std::fseek(fp, pos, SEEK_SET) != 0)
        throwErrno();
    return size;
}